

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtpaths.cpp
# Opt level: O2

QString * searchStringOrError(QString *__return_storage_ptr__,QCommandLineParser *parser)

{
  long in_FS_OFFSET;
  DataPointer local_58;
  QArrayDataPointer<QString> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QCommandLineParser::positionalArguments();
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_40);
  if ((int)local_40.size != 1) {
    local_58.d = (Data *)0x0;
    local_58.ptr = L"Exactly one argument needed as searchitem";
    local_58.size = 0x29;
    QString::QString((QString *)&local_40,&local_58);
    error((QString *)&local_40);
  }
  QCommandLineParser::positionalArguments();
  QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&(local_40.ptr)->d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString searchStringOrError(QCommandLineParser *parser)
{
    int positionalArgumentCount = parser->positionalArguments().size();
    if (positionalArgumentCount != 1)
        error(QStringLiteral("Exactly one argument needed as searchitem"));
    return parser->positionalArguments().constFirst();
}